

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_gainer_get_heap_size(ma_gainer_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if (((pHeapSizeInBytes != (size_t *)0x0) &&
      (*pHeapSizeInBytes = 0, pConfig != (ma_gainer_config *)0x0)) &&
     ((ulong)pConfig->channels != 0)) {
    *pHeapSizeInBytes = (ulong)pConfig->channels << 3;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_gainer_get_heap_size(const ma_gainer_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_gainer_heap_layout heapLayout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    result = ma_gainer_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = heapLayout.sizeInBytes;

    return MA_SUCCESS;
}